

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast_test.cpp
# Opt level: O0

bool run_test_type_conversion<std::shared_ptr<int>const&>(Boxed_Value *bv,bool expectedpass)

{
  bad_boxed_cast *e;
  exception *e_1;
  shared_ptr<int> local_38;
  shared_ptr<int> *local_28;
  shared_ptr<int> *ret;
  Boxed_Value *pBStack_18;
  bool expectedpass_local;
  Boxed_Value *bv_local;
  
  ret._7_1_ = expectedpass;
  pBStack_18 = bv;
  chaiscript::boxed_cast<std::shared_ptr<int>const&>
            ((chaiscript *)&local_38,bv,(Type_Conversions_State *)0x0);
  local_28 = &local_38;
  std::shared_ptr<int>::shared_ptr((shared_ptr<int> *)&e_1,local_28);
  use<std::shared_ptr<int>>((shared_ptr<int> *)&e_1);
  std::shared_ptr<int>::~shared_ptr((shared_ptr<int> *)&e_1);
  std::shared_ptr<int>::~shared_ptr(&local_38);
  return (bool)(ret._7_1_ & 1);
}

Assistant:

bool run_test_type_conversion(const Boxed_Value &bv, bool expectedpass) {
  try {
    To ret = chaiscript::boxed_cast<To>(bv);
    use(ret);
  } catch (const chaiscript::exception::bad_boxed_cast &e) {
    if (expectedpass) {
      std::cerr << "Failure in run_test_type_conversion: " << e.what() << '\n';
      return false;
    }
    return true;
  } catch (const std::exception &e) {
    std::cerr << "Unexpected standard exception when attempting cast_conversion: " << e.what() << '\n';
    return false;
  } catch (...) {
    std::cerr << "Unexpected unknown exception when attempting cast_conversion.\n";
    return false;
  }

  return expectedpass;
}